

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

void xmlSchemaDump(FILE *output,xmlSchemaPtr schema)

{
  if (output == (FILE *)0x0) {
    return;
  }
  if (schema != (xmlSchemaPtr)0x0) {
    fwrite("Schemas: ",9,1,(FILE *)output);
    if (schema->name == (xmlChar *)0x0) {
      fwrite("no name, ",9,1,(FILE *)output);
    }
    else {
      fprintf((FILE *)output,"%s, ");
    }
    if (schema->targetNamespace == (xmlChar *)0x0) {
      fwrite("no target namespace",0x13,1,(FILE *)output);
    }
    else {
      fputs((char *)schema->targetNamespace,(FILE *)output);
    }
    fputc(10,(FILE *)output);
    if (schema->annot != (xmlSchemaAnnotPtr)0x0) {
      xmlSchemaAnnotDump(output,schema->annot);
    }
    xmlHashScan(schema->typeDecl,xmlSchemaTypeDumpEntry,output);
    xmlHashScanFull(schema->elemDecl,xmlSchemaElementDump,output);
    return;
  }
  fwrite("Schemas: NULL\n",0xe,1,(FILE *)output);
  return;
}

Assistant:

void
xmlSchemaDump(FILE * output, xmlSchemaPtr schema)
{
    if (output == NULL)
        return;
    if (schema == NULL) {
        fprintf(output, "Schemas: NULL\n");
        return;
    }
    fprintf(output, "Schemas: ");
    if (schema->name != NULL)
        fprintf(output, "%s, ", schema->name);
    else
        fprintf(output, "no name, ");
    if (schema->targetNamespace != NULL)
        fprintf(output, "%s", (const char *) schema->targetNamespace);
    else
        fprintf(output, "no target namespace");
    fprintf(output, "\n");
    if (schema->annot != NULL)
        xmlSchemaAnnotDump(output, schema->annot);
    xmlHashScan(schema->typeDecl, xmlSchemaTypeDumpEntry, output);
    xmlHashScanFull(schema->elemDecl, xmlSchemaElementDump, output);
}